

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

shared_ptr<GenApi_3_4::CChunkAdapter> __thiscall
rcg::getChunkAdapter(rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,string *tltype)

{
  bool bVar1;
  CChunkAdapterGEV *this_00;
  CChunkAdapterU3V *this_01;
  CChunkAdapterGeneric *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<GenApi_3_4::CChunkAdapter> sVar3;
  __shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  bVar1 = setBoolean(nodemap,"ChunkModeActive",true,false);
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    bVar1 = std::operator==(tltype,"GEV");
    if (bVar1) {
      this_00 = (CChunkAdapterGEV *)operator_new(0x18);
      GenApi_3_4::CChunkAdapterGEV::CChunkAdapterGEV
                (this_00,(((nodemap->
                           super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,-1
                );
      std::__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<GenApi_3_4::CChunkAdapterGEV,void>
                ((__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
                 this_00);
    }
    else {
      bVar1 = std::operator==(tltype,"U3V");
      if (bVar1) {
        this_01 = (CChunkAdapterU3V *)operator_new(0x18);
        GenApi_3_4::CChunkAdapterU3V::CChunkAdapterU3V
                  (this_01,(((nodemap->
                             super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                           _Ptr,-1);
        std::__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<GenApi_3_4::CChunkAdapterU3V,void>
                  ((__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
                   this_01);
      }
      else {
        this_02 = (CChunkAdapterGeneric *)operator_new(0x18);
        GenApi_3_4::CChunkAdapterGeneric::CChunkAdapterGeneric
                  (this_02,(((nodemap->
                             super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                           _Ptr,-1);
        std::__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<GenApi_3_4::CChunkAdapterGeneric,void>
                  ((__shared_ptr<GenApi_3_4::CChunkAdapter,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
                   this_02);
      }
    }
    std::__shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2> *)this,
               &_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<GenApi_3_4::CChunkAdapter>)
         sVar3.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CChunkAdapter> getChunkAdapter(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap,
                                                       const std::string &tltype)
{
  std::shared_ptr<GenApi::CChunkAdapter> chunkadapter;

  if (setBoolean(nodemap, "ChunkModeActive", true))
  {
    if (tltype == "GEV")
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGEV(nodemap->_Ptr));
    }
    else if (tltype == "U3V")
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterU3V(nodemap->_Ptr));
    }
    else
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGeneric(nodemap->_Ptr));
    }
  }

  return chunkadapter;
}